

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O0

QRectF * __thiscall QGraphicsWidget::windowFrameGeometry(QGraphicsWidget *this)

{
  long lVar1;
  bool bVar2;
  pointer pQVar3;
  QRectF *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  qreal qVar4;
  qreal yp2;
  QGraphicsWidgetPrivate *d;
  QRectF *xp1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  xp1 = in_RDI;
  d_func((QGraphicsWidget *)0xa4bfc4);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_> *)0xa4bfda);
  if (bVar2) {
    QGraphicsLayoutItem::geometry((QGraphicsLayoutItem *)in_RDI);
    pQVar3 = std::unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_>::operator->
                       ((unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_> *)0xa4c007);
    qVar4 = QMarginsF::left(pQVar3);
    qVar4 = -qVar4;
    pQVar3 = std::unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_>::operator->
                       ((unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_> *)0xa4c03d);
    QMarginsF::top(pQVar3);
    pQVar3 = std::unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_>::operator->
                       ((unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_> *)0xa4c072);
    yp2 = QMarginsF::right(pQVar3);
    pQVar3 = std::unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_>::operator->
                       ((unique_ptr<QMarginsF,_std::default_delete<QMarginsF>_> *)0xa4c091);
    QMarginsF::bottom(pQVar3);
    QRectF::adjusted(in_RSI,(qreal)xp1,(qreal)in_RDI,qVar4,yp2);
  }
  else {
    QGraphicsLayoutItem::geometry((QGraphicsLayoutItem *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return xp1;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsWidget::windowFrameGeometry() const
{
    Q_D(const QGraphicsWidget);
    return d->windowFrameMargins
        ? geometry().adjusted(-d->windowFrameMargins->left(), -d->windowFrameMargins->top(),
                              d->windowFrameMargins->right(), d->windowFrameMargins->bottom())
        : geometry();
}